

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O0

void __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>::pool_t
          (pool_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_> *this,
          size_t alloc_nb,size_t alloc_size)

{
  unsigned_long *puVar1;
  invalid_argument *this_00;
  size_t local_20;
  size_t alloc_size_local;
  size_t alloc_nb_local;
  pool_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_> *this_local;
  
  this->_alloc_nb = alloc_nb;
  local_20 = alloc_size;
  alloc_size_local = alloc_nb;
  alloc_nb_local = (size_t)this;
  puVar1 = std::max<unsigned_long>(&local_20,&MIN_ALLOC_SIZE);
  this->_alloc_size = *puVar1;
  this->_block_size = this->_alloc_nb * this->_alloc_size + 8;
  this->_blocks_count = 0;
  this->_free_head = (char *)0x0;
  this->_block_head = (char *)0x0;
  this->_raw_head = (char *)0x0;
  this->_raw_end = (char *)0x0;
  std::
  vector<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
  ::vector(&this->_collectables);
  if (this->_alloc_nb == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"allocation number should be >= 1");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

pool_t(std::size_t alloc_nb, std::size_t alloc_size)
      : _alloc_nb(alloc_nb), _alloc_size(std::max(alloc_size, MIN_ALLOC_SIZE)),
        _block_size(_alloc_nb * _alloc_size + sizeof(void *)), _blocks_count(0), _free_head(nullptr), _block_head(nullptr),
        _raw_head(nullptr), _raw_end(nullptr)
  {
    if (_alloc_nb < 1)
      throw std::invalid_argument("allocation number should be >= 1");
  }